

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerline.cc
# Opt level: O2

void powerline(ostringstream *oss,char *color,POWERLINE_DIRECTION direction,bool background_only)

{
  ostream *poVar1;
  allocator aaStack_58 [32];
  string colorstr;
  
  if (direction == POWERLINE_RIGHT) {
    poVar1 = std::operator<<((ostream *)oss,' ');
    bg2fg(color);
    poVar1 = std::operator<<(poVar1,bg2fg::buf);
    oss = (ostringstream *)std::operator<<(poVar1,anon_var_dwarf_aa93);
  }
  else if (direction == POWERLINE_LEFT) {
    if (!background_only) {
      std::__cxx11::string::string((string *)&colorstr,color,aaStack_58);
      poVar1 = std::operator<<((ostream *)oss,"#[");
      std::__cxx11::string::find((char *)&colorstr,0x105f15);
      std::__cxx11::string::substr((ulong)aaStack_58,(ulong)&colorstr);
      poVar1 = std::operator<<(poVar1,(string *)aaStack_58);
      poVar1 = std::operator<<(poVar1,anon_var_dwarf_aa7d);
      std::operator<<(poVar1,color);
      std::__cxx11::string::~string((string *)aaStack_58);
      std::__cxx11::string::~string((string *)&colorstr);
      return;
    }
    oss = (ostringstream *)std::operator<<((ostream *)oss,' ');
    bg2fg(color);
    color = bg2fg::buf;
  }
  else if (direction != NONE) {
    return;
  }
  std::operator<<((ostream *)oss,color);
  return;
}

Assistant:

void powerline( std::ostringstream & oss, const char color[],
  POWERLINE_DIRECTION direction, bool background_only )
{
  switch( direction )
    {
  case NONE:
    oss << color;
    break;
  case POWERLINE_LEFT:
    if( background_only )
      {
      oss << ' ' << bg2fg( color );
      }
    else
      {
      std::string colorstr( color );
      oss << "#[" << colorstr.substr( colorstr.find( "," ) + 1 )
          << PWL_LEFT_FILLED
          << color;
      }
    break;
  case POWERLINE_RIGHT:
    oss << ' '
        << bg2fg( color )
        << PWL_RIGHT_FILLED
        << color;
    break;
    };
}